

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void int_list_intersect(int *a,int *b,int *c)

{
  int iVar1;
  int *local_20;
  int *c_local;
  int *b_local;
  int *a_local;
  
  local_20 = c;
  c_local = b;
  b_local = a;
LAB_0015ae80:
  do {
    if (*c_local < 0) {
LAB_0015af29:
      *b_local = -1;
      return;
    }
    while( true ) {
      iVar1 = *local_20;
      while( true ) {
        if (iVar1 < 0) goto LAB_0015af29;
        if (*c_local == *local_20) {
          *b_local = *c_local;
          local_20 = local_20 + 1;
          c_local = c_local + 1;
          b_local = b_local + 1;
          goto LAB_0015ae80;
        }
        if (*local_20 <= *c_local) break;
        c_local = c_local + 1;
        iVar1 = *c_local;
      }
      if (*c_local <= *local_20) break;
      local_20 = local_20 + 1;
    }
  } while( true );
}

Assistant:

void int_list_intersect(int *a, int *b, int *c) {
  while (1) {
    if (*b < 0) break;
  Lagainc:
    if (*c < 0) break;
  Lagainb:
    if (*b == *c) {
      *a++ = *b++;
      c++;
      continue;
    }
    if (*b < *c) {
      b++;
      if (*b < 0) break;
      goto Lagainb;
    }
    if (*c < *b) {
      c++;
      goto Lagainc;
    }
  }
  *a++ = -1;
}